

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.h
# Opt level: O3

int __thiscall MlmWrap::processOtherMsg(MlmWrap *this,char *sender,char *subject,TrodesMsg *msg)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Other msg type [",0x10);
  if (subject == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2f3648);
  }
  else {
    sVar1 = strlen(subject);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,subject,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"] not recognized.\n",0x12);
  return 0;
}

Assistant:

virtual int processOtherMsg(const char *sender, const char *subject, TrodesMsg &msg) {std::cout << "Other msg type [" << subject << "] not recognized.\n"; return(0);}